

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O1

UDate icu_63::parseDate(UChar *text,UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  UErrorCode UVar3;
  int32_t dom;
  ulong uVar4;
  int iVar5;
  int32_t month;
  int32_t year;
  int iVar6;
  UDate UVar7;
  double dVar8;
  double dVar9;
  
  if (U_ZERO_ERROR < *status) {
    return 0.0;
  }
  iVar2 = u_strlen_63(text);
  if ((iVar2 == 10) || (iVar2 == 0x10)) {
    UVar3 = *status;
    year = 0;
    if (UVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar4 = 0;
      year = 0;
      do {
        iVar5 = (ushort)text[uVar4] - 0x30;
        if (9 < (ushort)((ushort)text[uVar4] - 0x30)) {
          iVar5 = -1;
        }
        if (iVar5 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
          UVar3 = U_INVALID_FORMAT_ERROR;
        }
        else {
          year = iVar5 + year * 10;
        }
      } while ((uVar4 < 3) && (uVar4 = uVar4 + 1, UVar3 < U_ILLEGAL_ARGUMENT_ERROR));
    }
    UVar3 = *status;
    month = -1;
    if (UVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar5 = 0;
      uVar4 = 5;
      do {
        iVar6 = (ushort)text[uVar4] - 0x30;
        if (9 < (ushort)((ushort)text[uVar4] - 0x30)) {
          iVar6 = -1;
        }
        if (iVar6 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
          UVar3 = U_INVALID_FORMAT_ERROR;
        }
        else {
          iVar5 = iVar6 + iVar5 * 10;
        }
      } while ((uVar4 < 6) && (uVar4 = uVar4 + 1, UVar3 < U_ILLEGAL_ARGUMENT_ERROR));
      month = iVar5 + -1;
    }
    UVar3 = *status;
    iVar5 = 0;
    dom = 0;
    if (UVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
      dom = 0;
      uVar4 = 8;
      do {
        iVar6 = (ushort)text[uVar4] - 0x30;
        if (9 < (ushort)((ushort)text[uVar4] - 0x30)) {
          iVar6 = -1;
        }
        if (iVar6 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
          UVar3 = U_INVALID_FORMAT_ERROR;
        }
        else {
          dom = iVar6 + dom * 10;
        }
      } while ((uVar4 < 9) && (uVar4 = uVar4 + 1, UVar3 < U_ILLEGAL_ARGUMENT_ERROR));
    }
    UVar7 = 0.0;
    dVar9 = 0.0;
    if (iVar2 == 0x10) {
      UVar3 = *status;
      iVar5 = 0;
      if (UVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar5 = 0;
        uVar4 = 0xb;
        do {
          iVar6 = (ushort)text[uVar4] - 0x30;
          if (9 < (ushort)((ushort)text[uVar4] - 0x30)) {
            iVar6 = -1;
          }
          if (iVar6 < 0) {
            *status = U_INVALID_FORMAT_ERROR;
            UVar3 = U_INVALID_FORMAT_ERROR;
          }
          else {
            iVar5 = iVar6 + iVar5 * 10;
          }
        } while ((uVar4 < 0xc) && (uVar4 = uVar4 + 1, UVar3 < U_ILLEGAL_ARGUMENT_ERROR));
      }
      UVar3 = *status;
      if (UVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar6 = 0;
        uVar4 = 0xe;
        do {
          iVar1 = (ushort)text[uVar4] - 0x30;
          if (9 < (ushort)((ushort)text[uVar4] - 0x30)) {
            iVar1 = -1;
          }
          if (iVar1 < 0) {
            *status = U_INVALID_FORMAT_ERROR;
            UVar3 = U_INVALID_FORMAT_ERROR;
          }
          else {
            iVar6 = iVar1 + iVar6 * 10;
          }
        } while ((uVar4 < 0xf) && (uVar4 = uVar4 + 1, UVar3 < U_ILLEGAL_ARGUMENT_ERROR));
        dVar9 = (double)(iVar6 * 60000);
      }
      else {
        dVar9 = 0.0;
      }
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      dVar8 = Grego::fieldsToDay(year,month,dom);
      UVar7 = dVar8 * 86400000.0 + (double)(iVar5 * 3600000) + dVar9;
    }
  }
  else {
    *status = U_INVALID_FORMAT_ERROR;
    UVar7 = 0.0;
  }
  return UVar7;
}

Assistant:

static UDate
parseDate (const UChar *text, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return 0;
    }
    int32_t len = u_strlen(text);
    if (len != 16 && len != 10) {
        // It must be yyyy-MM-dd HH:mm (length 16) or yyyy-MM-dd (length 10)
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }

    int32_t year = 0, month = 0, day = 0, hour = 0, min = 0, n;
    int32_t idx;

    // "yyyy" (0 - 3)
    for (idx = 0; idx <= 3 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            year = 10*year + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    // "MM" (5 - 6)
    for (idx = 5; idx <= 6 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            month = 10*month + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    // "dd" (8 - 9)
    for (idx = 8; idx <= 9 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            day = 10*day + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    if (len == 16) {
        // "HH" (11 - 12)
        for (idx = 11; idx <= 12 && U_SUCCESS(status); idx++) {
            n = ASCII_DIGIT((int32_t)text[idx]);
            if (n >= 0) {
                hour = 10*hour + n;
            } else {
                status = U_INVALID_FORMAT_ERROR;
            }
        }
        // "mm" (14 - 15)
        for (idx = 14; idx <= 15 && U_SUCCESS(status); idx++) {
            n = ASCII_DIGIT((int32_t)text[idx]);
            if (n >= 0) {
                min = 10*min + n;
            } else {
                status = U_INVALID_FORMAT_ERROR;
            }
        }
    }

    if (U_SUCCESS(status)) {
        UDate date = Grego::fieldsToDay(year, month - 1, day) * U_MILLIS_PER_DAY
            + hour * U_MILLIS_PER_HOUR + min * U_MILLIS_PER_MINUTE;
        return date;
    }
    return 0;
}